

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model_addTwoNamedComponents_Test::TestBody(Model_addTwoNamedComponents_Test *this)

{
  char *pcVar1;
  AssertHelper aAStack_e8 [8];
  Message local_e0 [8];
  ModelPtr m;
  AssertionResult gtest_ar;
  ComponentPtr c2;
  ComponentPtr c1;
  PrinterPtr printer;
  string a;
  string e;
  string name2;
  string name1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name1,"component_1",(allocator<char> *)&name2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name2,"component_2",(allocator<char> *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component_1\"/>\n  <component name=\"component_2\"/>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::NamedEntity::setName
            ((string *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Component::create();
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::NamedEntity::setName
            ((string *)
             c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","a",&e,&a);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0xae,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&name2);
  std::__cxx11::string::~string((string *)&name1);
  return;
}

Assistant:

TEST(Model, addTwoNamedComponents)
{
    const std::string name1 = "component_1";
    const std::string name2 = "component_2";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component_1\"/>\n"
        "  <component name=\"component_2\"/>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    c1->setName(name1);
    m->addComponent(c1);
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    m->addComponent(c2);
    // once the component is added, we should be able to change the handle to the component and have those changes
    // reflected in the model? Yes we are using shared pointers.
    c2->setName(name2); // so should this give an error? Nope

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}